

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opn_chip_base.h
# Opt level: O2

void __thiscall
OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>::OPNChipBaseBufferedT
          (OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U> *this,OPNFamily f)

{
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase.m_id = 0;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase.m_rate = 0xac44;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase.m_clock = 0x750ab6;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase.m_family = f;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_runningAtPcmRate = false;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_samplecnt = 0;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_oldsamples[0] = 0;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_oldsamples[1] = 0;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_samples[0] = 0;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_samples[1] = 0;
  *(undefined8 *)&(this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).m_rateratio = 0x34f;
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase._vptr_OPNChipBase =
       (_func_int **)&PTR__OPNChipBase_00213cf0;
  return;
}

Assistant:

explicit OPNChipBaseBufferedT(OPNFamily f)
        : OPNChipBaseT<T>(f), m_bufferIndex(0) {}